

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

void dictionary_del(dictionary *d)

{
  long lVar1;
  
  if (d != (dictionary *)0x0) {
    if (0 < d->size) {
      lVar1 = 0;
      do {
        if (d->key[lVar1] != (char *)0x0) {
          free(d->key[lVar1]);
        }
        if (d->val[lVar1] != (char *)0x0) {
          free(d->val[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < d->size);
    }
    free(d->val);
    free(d->key);
    free(d->hash);
    free(d);
    return;
  }
  return;
}

Assistant:

void dictionary_del(dictionary * d)
{
    ssize_t  i ;

    if (d == NULL) return ;
    for (i = 0 ; i < d->size ; i++) {
        if (d->key[i] != NULL)
            free(d->key[i]);
        if (d->val[i] != NULL)
            free(d->val[i]);
    }
    free(d->val);
    free(d->key);
    free(d->hash);
    free(d);
    return ;
}